

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O0

void __thiscall Assimp::ScenePreprocessor::ProcessMesh(ScenePreprocessor *this,aiMesh *mesh)

{
  uint uVar1;
  undefined1 auVar2 [16];
  Logger *this_00;
  ulong uVar3;
  ulong uVar4;
  aiVector3D *paVar5;
  aiVector3t<float> aVar6;
  aiVector3t<float> *local_80;
  undefined8 local_60;
  float local_58;
  uint local_44;
  uint i_1;
  aiFace *face;
  uint a;
  aiVector3D *end;
  aiVector3D *p;
  uint i;
  aiMesh *mesh_local;
  ScenePreprocessor *this_local;
  
  for (p._4_4_ = 0; p._4_4_ < 8; p._4_4_ = p._4_4_ + 1) {
    if (mesh->mTextureCoords[p._4_4_] == (aiVector3D *)0x0) {
      mesh->mNumUVComponents[p._4_4_] = 0;
    }
    else {
      if (mesh->mNumUVComponents[p._4_4_] == 0) {
        mesh->mNumUVComponents[p._4_4_] = 2;
      }
      end = mesh->mTextureCoords[p._4_4_];
      paVar5 = end + mesh->mNumVertices;
      if (mesh->mNumUVComponents[p._4_4_] == 2) {
        for (; end != paVar5; end = end + 1) {
          end->z = 0.0;
        }
      }
      else if (mesh->mNumUVComponents[p._4_4_] == 1) {
        for (; end != paVar5; end = end + 1) {
          end->y = 0.0;
          end->z = 0.0;
        }
      }
      else if (mesh->mNumUVComponents[p._4_4_] == 3) {
        for (; ((end != paVar5 && (end->z == 0.0)) && (!NAN(end->z))); end = end + 1) {
        }
        if (end == paVar5) {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,
                       "ScenePreprocessor: UVs are declared to be 3D but they\'re obviously not. Reverting to 2D."
                      );
          mesh->mNumUVComponents[p._4_4_] = 2;
        }
      }
    }
  }
  if (mesh->mPrimitiveTypes == 0) {
    for (face._4_4_ = 0; face._4_4_ < mesh->mNumFaces; face._4_4_ = face._4_4_ + 1) {
      uVar1 = mesh->mFaces[face._4_4_].mNumIndices;
      if (uVar1 == 1) {
        mesh->mPrimitiveTypes = mesh->mPrimitiveTypes | 1;
      }
      else if (uVar1 == 2) {
        mesh->mPrimitiveTypes = mesh->mPrimitiveTypes | 2;
      }
      else if (uVar1 == 3) {
        mesh->mPrimitiveTypes = mesh->mPrimitiveTypes | 4;
      }
      else {
        mesh->mPrimitiveTypes = mesh->mPrimitiveTypes | 8;
      }
    }
  }
  if (((mesh->mTangents != (aiVector3D *)0x0) && (mesh->mNormals != (aiVector3D *)0x0)) &&
     (mesh->mBitangents == (aiVector3D *)0x0)) {
    uVar3 = CONCAT44(0,mesh->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    paVar5 = (aiVector3D *)operator_new__(uVar4);
    if (uVar3 != 0) {
      local_80 = paVar5;
      do {
        aiVector3t<float>::aiVector3t(local_80);
        local_80 = local_80 + 1;
      } while (local_80 != paVar5 + uVar3);
    }
    mesh->mBitangents = paVar5;
    for (local_44 = 0; local_44 < mesh->mNumVertices; local_44 = local_44 + 1) {
      aVar6 = operator^(mesh->mNormals + local_44,mesh->mTangents + local_44);
      local_60 = aVar6._0_8_;
      local_58 = aVar6.z;
      paVar5 = mesh->mBitangents + local_44;
      paVar5->x = (float)(undefined4)local_60;
      paVar5->y = (float)local_60._4_4_;
      paVar5->z = local_58;
    }
  }
  return;
}

Assistant:

void ScenePreprocessor::ProcessMesh (aiMesh* mesh)
{
    // If aiMesh::mNumUVComponents is *not* set assign the default value of 2
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i)   {
        if (!mesh->mTextureCoords[i]) {
            mesh->mNumUVComponents[i] = 0;
        } else {
            if (!mesh->mNumUVComponents[i])
                mesh->mNumUVComponents[i] = 2;

            aiVector3D* p = mesh->mTextureCoords[i], *end = p+mesh->mNumVertices;

            // Ensure unused components are zeroed. This will make 1D texture channels work
            // as if they were 2D channels .. just in case an application doesn't handle
            // this case
            if (2 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = 0.f;
            }
            else if (1 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = p->y = 0.f;
            }
            else if (3 == mesh->mNumUVComponents[i]) {
                // Really 3D coordinates? Check whether the third coordinate is != 0 for at least one element
                for (; p != end; ++p) {
                    if (p->z != 0)
                        break;
                }
                if (p == end) {
                    ASSIMP_LOG_WARN("ScenePreprocessor: UVs are declared to be 3D but they're obviously not. Reverting to 2D.");
                    mesh->mNumUVComponents[i] = 2;
                }
            }
        }
    }

    // If the information which primitive types are there in the
    // mesh is currently not available, compute it.
    if (!mesh->mPrimitiveTypes) {
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)  {
            aiFace& face = mesh->mFaces[a];
            switch (face.mNumIndices)
            {
            case 3u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                break;

            case 2u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                break;

            case 1u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                break;

            default:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                break;
            }
        }
    }

    // If tangents and normals are given but no bitangents compute them
    if (mesh->mTangents && mesh->mNormals && !mesh->mBitangents)    {

        mesh->mBitangents = new aiVector3D[mesh->mNumVertices];
        for (unsigned int i = 0; i < mesh->mNumVertices;++i)    {
            mesh->mBitangents[i] = mesh->mNormals[i] ^ mesh->mTangents[i];
        }
    }
}